

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O1

int * If_CutArrTimeProfile(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    pVVar2 = p->vObjs;
    uVar3 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar3];
      if (((long)(int)fVar1 < 0) || (pVVar2->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p->pArrTimeProfile[uVar3] = (int)*(float *)((long)pVVar2->pArray[(int)fVar1] + 0x5c);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (byte)pCut->field_0x1f);
  }
  return p->pArrTimeProfile;
}

Assistant:

int * If_CutArrTimeProfile( If_Man_t * p, If_Cut_t * pCut )
{
    int i;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        p->pArrTimeProfile[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
    return p->pArrTimeProfile;
}